

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int nn_pipebase_start(nn_pipebase *self)

{
  int rc;
  nn_pipebase *self_local;
  
  if (self->state != '\x01') {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)self->state,
            "NN_PIPEBASE_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/pipe.c"
            ,0x4f);
    fflush(_stderr);
    nn_err_abort();
  }
  self->state = '\x02';
  self->instate = '\x04';
  self->outstate = '\x01';
  self_local._4_4_ = nn_sock_add(self->sock,(nn_pipe *)self);
  if (self_local._4_4_ < 0) {
    self->state = '\x03';
  }
  else {
    if (self->sock != (nn_sock *)0x0) {
      nn_fsm_raise(&self->fsm,&self->out,0x84c4);
    }
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

int nn_pipebase_start (struct nn_pipebase *self)
{
    int rc;

    nn_assert_state (self, NN_PIPEBASE_STATE_IDLE);

    self->state = NN_PIPEBASE_STATE_ACTIVE;
    self->instate = NN_PIPEBASE_INSTATE_ASYNC;
    self->outstate = NN_PIPEBASE_OUTSTATE_IDLE;
    rc = nn_sock_add (self->sock, (struct nn_pipe*) self);
    if (nn_slow (rc < 0)) {
        self->state = NN_PIPEBASE_STATE_FAILED;
        return rc;
    }
    if (self->sock)
        nn_fsm_raise (&self->fsm, &self->out, NN_PIPE_OUT);

    return 0;
}